

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Snapshot::SetCurrentBinaryDirectory(Snapshot *this,string *dir)

{
  string *p;
  PointerType pSVar1;
  PointerType pBVar2;
  string local_40;
  string *local_20;
  string *loc;
  string *dir_local;
  Snapshot *this_local;
  
  loc = dir;
  dir_local = (string *)this;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
  local_20 = &pBVar2->OutputLocation;
  std::__cxx11::string::operator=((string *)local_20,(string *)loc);
  cmsys::SystemTools::ConvertToUnixSlashes(local_20);
  cmsys::SystemTools::CollapseFullPath(&local_40,local_20);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  p = local_20;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
  cmsys::SystemTools::SplitPath(p,&pBVar2->CurrentBinaryDirectoryComponents,true);
  ComputeRelativePathTopBinary(this);
  return;
}

Assistant:

void cmState::Snapshot::SetCurrentBinaryDirectory(std::string const& dir)
{
  std::string& loc = this->Position->BuildSystemDirectory->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->Position->BuildSystemDirectory->CurrentBinaryDirectoryComponents);
  this->ComputeRelativePathTopBinary();
}